

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall
icu_63::TailoredSet::compare(TailoredSet *this,UChar32 c,uint32_t ce32,uint32_t baseCE32)

{
  long lVar1;
  long lVar2;
  UChar *pUVar3;
  uint uVar4;
  UBool UVar5;
  uint32_t uVar6;
  uint uVar7;
  int32_t iVar8;
  undefined8 in_RAX;
  ulong uVar9;
  uint uVar10;
  undefined2 *puVar11;
  CollationData *d;
  uint uVar12;
  ulong uVar13;
  UChar *pUVar14;
  uint uVar15;
  uint uStack_40;
  undefined8 uStack_38;
  UChar jamos [3];
  
  uVar13 = (ulong)baseCE32;
  uVar9 = (ulong)ce32;
  uStack_38 = in_RAX;
  if ((ce32 & 0xcf) == 200) {
    pUVar14 = this->data->contexts + (ce32 >> 0xd);
    uVar6 = CollationData::getFinalCE32(this->data,CONCAT22(*pUVar14,pUVar14[1]));
    uVar9 = (ulong)uVar6;
    if ((baseCE32 & 0xcf) == 200) {
      pUVar3 = this->baseData->contexts + (baseCE32 >> 0xd);
      uVar6 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar3,pUVar3[1]));
      uVar13 = (ulong)uVar6;
      comparePrefixes(this,c,pUVar14 + 2,pUVar3 + 2);
    }
    else {
      d = this->data;
LAB_0023d6fb:
      addPrefixes(this,d,c,pUVar14 + 2);
    }
  }
  else if ((baseCE32 & 0xcf) == 200) {
    pUVar14 = this->baseData->contexts + (baseCE32 >> 0xd);
    uVar6 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar14,pUVar14[1]));
    uVar13 = (ulong)uVar6;
    d = this->baseData;
    goto LAB_0023d6fb;
  }
  uVar12 = (uint)uVar13;
  if (((uint)uVar9 & 0xcf) == 0xc9) {
    pUVar14 = (UChar *)((ulong)((uint)(uVar9 >> 0xc) & 0xffffe) + (long)this->data->contexts);
    if (((uint)uVar9 >> 8 & 1) == 0) {
      uVar6 = CollationData::getFinalCE32(this->data,CONCAT22(*pUVar14,pUVar14[1]));
      uVar9 = (ulong)uVar6;
    }
    else {
      uVar9 = 1;
    }
    if ((uVar12 & 0xcf) == 0xc9) {
      puVar11 = (undefined2 *)
                ((ulong)((uint)(uVar13 >> 0xc) & 0xffffe) + (long)this->baseData->contexts);
      if ((uVar12 >> 8 & 1) == 0) {
        uVar6 = CollationData::getFinalCE32(this->baseData,CONCAT22(*puVar11,puVar11[1]));
        uVar13 = (ulong)uVar6;
      }
      else {
        uVar13 = 1;
      }
      compareContractions(this,c,pUVar14 + 2,puVar11 + 2);
    }
    else {
LAB_0023d7cf:
      addContractions(this,c,pUVar14 + 2);
    }
  }
  else if ((uVar12 & 0xcf) == 0xc9) {
    pUVar14 = this->baseData->contexts + (uVar12 >> 0xd);
    uVar6 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar14,pUVar14[1]));
    uVar13 = (ulong)uVar6;
    goto LAB_0023d7cf;
  }
  uVar15 = (uint)uVar9;
  uVar12 = (uint)uVar13;
  if ((~uVar12 & 0xc0) == 0) {
    uStack_40 = uVar12 & 0xf;
    if (uStack_40 == 0xe) {
      if (((uVar15 & 0xcf) != 0xc1) ||
         (uVar6 = Collation::getThreeBytePrimaryForOffsetData(c,this->baseData->ces[uVar13 >> 0xd]),
         (uVar15 & 0xffffff00) != uVar6)) goto LAB_0023d98e;
      uStack_40 = 0xe;
    }
  }
  else {
    uStack_40 = 0xffffffff;
  }
  uVar10 = -(uint)((~uVar15 & 0xc0) != 0) | uVar15 & 0xf;
  if (uVar10 == uStack_40) {
    if (uVar10 == 0xc) {
      iVar8 = Hangul::decompose(c,jamos);
      UVar5 = UnicodeSet::contains(this->tailored,(uint)(ushort)jamos[0]);
      if (UVar5 == '\0') {
        UVar5 = UnicodeSet::contains(this->tailored,(uint)(ushort)jamos[1]);
        if (UVar5 == '\0') {
          if (iVar8 != 3) {
            return;
          }
          UVar5 = UnicodeSet::contains(this->tailored,(uint)(ushort)jamos[2]);
          if (UVar5 == '\0') {
            return;
          }
        }
      }
      add(this,c);
      return;
    }
    uVar7 = (uint)(uVar9 >> 8);
    uVar4 = (uint)(uVar13 >> 8);
    if (uVar10 == 6) {
      uVar7 = uVar7 & 0x1f;
      if (uVar7 == (uVar4 & 0x1f)) {
        uVar9 = 0;
        do {
          if (uVar7 == uVar9) {
            return;
          }
          lVar1 = uVar9 * 8;
          lVar2 = uVar9 * 8;
          uVar9 = uVar9 + 1;
        } while (*(long *)((long)this->data->ces + lVar1 + (ulong)(uVar15 >> 10 & 0xfffffff8)) ==
                 *(long *)((long)this->baseData->ces + lVar2 + (ulong)(uVar12 >> 10 & 0xfffffff8)));
      }
    }
    else if (uVar10 == 5) {
      uVar7 = uVar7 & 0x1f;
      if (uVar7 == (uVar4 & 0x1f)) {
        uVar9 = 0;
        do {
          if (uVar7 == uVar9) {
            return;
          }
          lVar1 = uVar9 * 4;
          lVar2 = uVar9 * 4;
          uVar9 = uVar9 + 1;
        } while (*(int *)((long)this->data->ce32s + lVar1 + (ulong)(uVar15 >> 0xb & 0xfffffffc)) ==
                 *(int *)((long)this->baseData->ce32s + lVar2 + (ulong)(uVar12 >> 0xb & 0xfffffffc))
                );
      }
    }
    else if (uVar15 == uVar12) {
      return;
    }
  }
LAB_0023d98e:
  add(this,c);
  return;
}

Assistant:

void
TailoredSet::compare(UChar32 c, uint32_t ce32, uint32_t baseCE32) {
    if(Collation::isPrefixCE32(ce32)) {
        const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
        ce32 = data->getFinalCE32(CollationData::readCE32(p));
        if(Collation::isPrefixCE32(baseCE32)) {
            const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
            baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
            comparePrefixes(c, p + 2, q + 2);
        } else {
            addPrefixes(data, c, p + 2);
        }
    } else if(Collation::isPrefixCE32(baseCE32)) {
        const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
        baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
        addPrefixes(baseData, c, q + 2);
    }

    if(Collation::isContractionCE32(ce32)) {
        const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
        if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
            ce32 = Collation::NO_CE32;
        } else {
            ce32 = data->getFinalCE32(CollationData::readCE32(p));
        }
        if(Collation::isContractionCE32(baseCE32)) {
            const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
            if((baseCE32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
                baseCE32 = Collation::NO_CE32;
            } else {
                baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
            }
            compareContractions(c, p + 2, q + 2);
        } else {
            addContractions(c, p + 2);
        }
    } else if(Collation::isContractionCE32(baseCE32)) {
        const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
        baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
        addContractions(c, q + 2);
    }

    int32_t tag;
    if(Collation::isSpecialCE32(ce32)) {
        tag = Collation::tagFromCE32(ce32);
        U_ASSERT(tag != Collation::PREFIX_TAG);
        U_ASSERT(tag != Collation::CONTRACTION_TAG);
        // Currently, the tailoring data builder does not write offset tags.
        // They might be useful for saving space,
        // but they would complicate the builder,
        // and in tailorings we assume that performance of tailored characters is more important.
        U_ASSERT(tag != Collation::OFFSET_TAG);
    } else {
        tag = -1;
    }
    int32_t baseTag;
    if(Collation::isSpecialCE32(baseCE32)) {
        baseTag = Collation::tagFromCE32(baseCE32);
        U_ASSERT(baseTag != Collation::PREFIX_TAG);
        U_ASSERT(baseTag != Collation::CONTRACTION_TAG);
    } else {
        baseTag = -1;
    }

    // Non-contextual mappings, expansions, etc.
    if(baseTag == Collation::OFFSET_TAG) {
        // We might be comparing a tailoring CE which is a copy of
        // a base offset-tag CE, via the [optimize [set]] syntax
        // or when a single-character mapping was copied for tailored contractions.
        // Offset tags always result in long-primary CEs,
        // with common secondary/tertiary weights.
        if(!Collation::isLongPrimaryCE32(ce32)) {
            add(c);
            return;
        }
        int64_t dataCE = baseData->ces[Collation::indexFromCE32(baseCE32)];
        uint32_t p = Collation::getThreeBytePrimaryForOffsetData(c, dataCE);
        if(Collation::primaryFromLongPrimaryCE32(ce32) != p) {
            add(c);
            return;
        }
    }

    if(tag != baseTag) {
        add(c);
        return;
    }

    if(tag == Collation::EXPANSION32_TAG) {
        const uint32_t *ce32s = data->ce32s + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);

        const uint32_t *baseCE32s = baseData->ce32s + Collation::indexFromCE32(baseCE32);
        int32_t baseLength = Collation::lengthFromCE32(baseCE32);

        if(length != baseLength) {
            add(c);
            return;
        }
        for(int32_t i = 0; i < length; ++i) {
            if(ce32s[i] != baseCE32s[i]) {
                add(c);
                break;
            }
        }
    } else if(tag == Collation::EXPANSION_TAG) {
        const int64_t *ces = data->ces + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);

        const int64_t *baseCEs = baseData->ces + Collation::indexFromCE32(baseCE32);
        int32_t baseLength = Collation::lengthFromCE32(baseCE32);

        if(length != baseLength) {
            add(c);
            return;
        }
        for(int32_t i = 0; i < length; ++i) {
            if(ces[i] != baseCEs[i]) {
                add(c);
                break;
            }
        }
    } else if(tag == Collation::HANGUL_TAG) {
        UChar jamos[3];
        int32_t length = Hangul::decompose(c, jamos);
        if(tailored->contains(jamos[0]) || tailored->contains(jamos[1]) ||
                (length == 3 && tailored->contains(jamos[2]))) {
            add(c);
        }
    } else if(ce32 != baseCE32) {
        add(c);
    }
}